

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O3

void __thiscall ccs::SearchState::append(SearchState *this,ostream *out,bool isPrefix)

{
  SearchState *this_00;
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  
  this_00 = (this->parent).super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  sVar1 = (this->key).values_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (this_00 == (SearchState *)0x0) {
    if (sVar1 == 0 && !isPrefix) {
      pcVar3 = "<root>";
      lVar2 = 6;
      goto LAB_00149525;
    }
  }
  else {
    append(this_00,out,sVar1 != 0 || isPrefix);
    sVar1 = (this->key).values_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  if (sVar1 != 0) {
    operator<<(out,&this->key);
    if (isPrefix) {
      pcVar3 = " > ";
      lVar2 = 3;
LAB_00149525:
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,lVar2);
      return;
    }
  }
  return;
}

Assistant:

void SearchState::append(std::ostream &out, bool isPrefix) const {
  if (parent) {
    parent->append(out, isPrefix || !key.empty());
  } else if (key.empty() && !isPrefix) {
    out << "<root>";
    return;
  }

  if (!key.empty()) {
    out << key;
    if (isPrefix) out << " > ";
  }
}